

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst-timerfd.c
# Opt level: O3

void * th2_func(void *arg)

{
  int __fd;
  ssize_t sVar1;
  void *extraout_RAX;
  long lVar2;
  long lVar3;
  timespec tVar4;
  timespec tVar5;
  uint64_t counter2;
  long local_20;
  
  __fd = *arg;
  tVar4 = steady_clock_now();
  sVar1 = read(__fd,&local_20,8);
  if (sVar1 == 8) {
    if (local_20 == 1) {
      tVar5 = steady_clock_now();
      lVar3 = tVar5.tv_nsec - tVar4.tv_nsec;
      lVar2 = lVar3 + 1000000000;
      if (-1 < lVar3) {
        lVar2 = lVar3;
      }
      if (499999999 < ((lVar3 >> 0x3f) + (tVar5.tv_sec - tVar4.tv_sec)) * 1000000000 + lVar2) {
        return (void *)0x0;
      }
      goto LAB_0010375f;
    }
  }
  else {
    th2_func_cold_1();
  }
  th2_func_cold_2();
LAB_0010375f:
  th2_func_cold_3();
  dotest(1);
  return extraout_RAX;
}

Assistant:

static void *
th2_func(void *arg)
{
	int fd = *(int *)arg;
	u64 counter2;
	struct timespec before = steady_clock_now();
	expect(read(fd, &counter2, sizeof(counter2)), (ssize_t)8);
	expect(counter2, (u64)1);
	struct timespec after = steady_clock_now();
	expectge(nano_diff(after, before), (int64_t)MS_TO_NSEC(500));
	return NULL;
}